

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O0

int ffgcxui(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG nrows,long input_first_bit,
           int input_nbits,unsigned_short *array,int *status)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_dc;
  char local_d8 [8];
  char message [81];
  tcolumn *colptr;
  unsigned_short colbyte [5];
  int lshift;
  int rshift;
  int nbytes;
  int lastbyte;
  int firstbyte;
  int endbit;
  int numbits;
  int startbit;
  int bytenum;
  int nbits;
  int firstbit;
  int ii;
  int input_nbits_local;
  long input_first_bit_local;
  LONGLONG nrows_local;
  LONGLONG firstrow_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (nrows != 0)) {
    if (firstrow < 1) {
      snprintf(local_d8,0x51,"Starting row number is less than 1: %ld (ffgcxui)",firstrow);
      ffpmsg(local_d8);
      *status = 0x133;
      fptr_local._4_4_ = 0x133;
    }
    else if (input_first_bit < 1) {
      snprintf(local_d8,0x51,"Starting bit number is less than 1: %ld (ffgcxui)",input_first_bit);
      ffpmsg(local_d8);
      *status = 0x134;
      fptr_local._4_4_ = 0x134;
    }
    else if (input_nbits < 0x11) {
      if (fptr->HDUposition == fptr->Fptr->curhdu) {
        if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
          return *status;
        }
      }
      else {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      if (fptr->Fptr->hdutype == 2) {
        if (fptr->Fptr->tfield < colnum) {
          snprintf(local_d8,0x51,"Specified column number is out of range: %d (ffgcxui)",
                   (ulong)(uint)colnum);
          ffpmsg(local_d8);
          snprintf(local_d8,0x51,"  There are %d columns in this table.",
                   (ulong)(uint)fptr->Fptr->tfield);
          ffpmsg(local_d8);
          *status = 0x12e;
          fptr_local._4_4_ = 0x12e;
        }
        else {
          register0x00000000 = fptr->Fptr->tableptr + (colnum + -1);
          iVar1 = register0x00000000->tdatatype;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          if (iVar1 < 0xc) {
            iVar1 = (int)((input_first_bit + -1) / 8) + 1;
            iVar2 = (int)((input_first_bit + input_nbits + -2) / 8) + 1;
            if ((register0x00000000->tdatatype == 1) &&
               (register0x00000000->trepeat < input_first_bit + input_nbits + -1)) {
              ffpmsg("Too many bits. Tried to read past width of column (ffgcxui)");
              *status = 0x134;
              fptr_local._4_4_ = 0x134;
            }
            else if ((register0x00000000->tdatatype == 0xb) &&
                    (register0x00000000->trepeat < (long)iVar2)) {
              ffpmsg("Too many bits. Tried to read past width of column (ffgcxui)");
              *status = 0x134;
              fptr_local._4_4_ = 0x134;
            }
            else {
              for (nbits = 0; nbits < nrows; nbits = nbits + 1) {
                iVar3 = ffgcvui(fptr,colnum,firstrow + nbits,(long)iVar1,(long)((iVar2 - iVar1) + 1)
                                ,0,(unsigned_short *)((long)&colptr + 2),(int *)0x0,status);
                if (0 < iVar3) {
                  ffpmsg("Error reading bytes from column (ffgcxui)");
                  return *status;
                }
                bytenum = (int)((input_first_bit + -1) % 8);
                array[nbits] = 0;
                for (startbit = input_nbits; startbit != 0; startbit = startbit - local_dc) {
                  iVar3 = bytenum % 8;
                  if (startbit < 8 - iVar3) {
                    local_dc = startbit;
                  }
                  else {
                    local_dc = 8 - iVar3;
                  }
                  colbyte._6_4_ = 7 - (iVar3 + local_dc + -1);
                  colbyte._2_4_ = startbit - local_dc;
                  array[nbits] = (ushort)(((int)(uint)*(ushort *)
                                                       ((long)&colptr + (long)(bytenum / 8) * 2 + 2)
                                          >> ((byte)colbyte._6_4_ & 0x1f)) <<
                                         ((byte)(startbit - local_dc) & 0x1f)) | array[nbits];
                  bytenum = local_dc + bytenum;
                }
              }
              fptr_local._4_4_ = *status;
            }
          }
          else {
            ffpmsg("Can only read bits from X or B type columns. (ffgcxui)");
            *status = 0x136;
            fptr_local._4_4_ = 0x136;
          }
        }
      }
      else {
        ffpmsg("This is not a binary table extension (ffgcxui)");
        *status = 0xe3;
        fptr_local._4_4_ = 0xe3;
      }
    }
    else {
      snprintf(local_d8,0x51,"Number of bits to read is > 16: %d (ffgcxui)",(ulong)(uint)input_nbits
              );
      ffpmsg(local_d8);
      *status = 0x134;
      fptr_local._4_4_ = 0x134;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcxui(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  nrows,      /* I - no. of rows to read                     */
            long  input_first_bit, /* I - first bit to read (1 = 1st)        */
            int   input_nbits,     /* I - number of bits to read (<= 32)     */
            unsigned short *array, /* O - array of integer values            */
            int  *status)     /* IO - error status                           */
/*
  Read a consecutive string of bits from an 'X' or 'B' column and
  interprete them as an unsigned integer.  The number of bits must be
  less than or equal to 16 or the total number of bits in the column, 
  which ever is less.
*/
{
    int ii, firstbit, nbits, bytenum, startbit, numbits, endbit;
    int firstbyte, lastbyte, nbytes, rshift, lshift;
    unsigned short colbyte[5];
    tcolumn *colptr;
    char message[FLEN_ERRMSG];

    if (*status > 0 || nrows == 0)
        return(*status);

    /*  check input parameters */
    if (firstrow < 1)
    {
          snprintf(message,FLEN_ERRMSG, "Starting row number is less than 1: %ld (ffgcxui)",
                (long) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
    }
    else if (input_first_bit < 1)
    {
          snprintf(message,FLEN_ERRMSG, "Starting bit number is less than 1: %ld (ffgcxui)",
                input_first_bit);
          ffpmsg(message);
          return(*status = BAD_ELEM_NUM);
    }
    else if (input_nbits > 16)
    {
          snprintf(message, FLEN_ERRMSG,"Number of bits to read is > 16: %d (ffgcxui)",
                input_nbits);
          ffpmsg(message);
          return(*status = BAD_ELEM_NUM);
    }

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype != BINARY_TBL)
    {
        ffpmsg("This is not a binary table extension (ffgcxui)");
        return(*status = NOT_BTABLE);
    }

    if (colnum > (fptr->Fptr)->tfield)
    {
      snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d (ffgcxui)",
                colnum);
        ffpmsg(message);
        snprintf(message, FLEN_ERRMSG,"  There are %d columns in this table.",
                (fptr->Fptr)->tfield );
        ffpmsg(message);

        return(*status = BAD_COL_NUM);
    }       

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    if (abs(colptr->tdatatype) > TBYTE)
    {
        ffpmsg("Can only read bits from X or B type columns. (ffgcxui)");
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */
    }

    firstbyte = (input_first_bit - 1              ) / 8 + 1;
    lastbyte  = (input_first_bit + input_nbits - 2) / 8 + 1;
    nbytes = lastbyte - firstbyte + 1;

    if (colptr->tdatatype == TBIT && 
        input_first_bit + input_nbits - 1 > (long) colptr->trepeat)
    {
        ffpmsg("Too many bits. Tried to read past width of column (ffgcxui)");
        return(*status = BAD_ELEM_NUM);
    }
    else if (colptr->tdatatype == TBYTE && lastbyte > (long) colptr->trepeat)
    {
        ffpmsg("Too many bits. Tried to read past width of column (ffgcxui)");
        return(*status = BAD_ELEM_NUM);
    }

    for (ii = 0; ii < nrows; ii++)
    {
        /* read the relevant bytes from the row */
        if (ffgcvui(fptr, colnum, firstrow+ii, firstbyte, nbytes, 0, 
               colbyte, NULL, status) > 0)
        {
             ffpmsg("Error reading bytes from column (ffgcxui)");
             return(*status);
        }

        firstbit = (input_first_bit - 1) % 8; /* modulus operator */
        nbits = input_nbits;

        array[ii] = 0;

        /* select and shift the bits from each byte into the output word */
        while(nbits)
        {
            bytenum = firstbit / 8;

            startbit = firstbit % 8;  
            numbits = minvalue(nbits, 8 - startbit);
            endbit = startbit + numbits - 1;

            rshift = 7 - endbit;
            lshift = nbits - numbits;

            array[ii] = ((colbyte[bytenum] >> rshift) << lshift) | array[ii];

            nbits -= numbits;
            firstbit += numbits;
        }
    }

    return(*status);
}